

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VFile.cpp
# Opt level: O2

ssize_t __thiscall blc::tools::VFile::write(VFile *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  exception *peVar2;
  undefined4 in_register_00000034;
  allocator<char> local_59;
  string local_58;
  string local_38;
  
  if (this->_isClosed != false) {
    peVar2 = (exception *)__cxa_allocate_exception(0x78);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Attempt to write on a closed virtual file",&local_59);
    error::exception::exception(peVar2,&local_58);
    __cxa_throw(peVar2,&error::exception::typeinfo,error::exception::~exception);
  }
  if ((string *)(long)this->_cursor <= (string *)(this->_cache)._M_string_length) {
    std::__cxx11::string::insert((ulong)&this->_cache,(string *)(long)this->_cursor);
    uVar1 = *(uint *)(CONCAT44(in_register_00000034,__fd) + 8);
    this->_cursor = this->_cursor + uVar1;
    return (ulong)uVar1;
  }
  peVar2 = (exception *)__cxa_allocate_exception(0x78);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Cursor exeeds the size of file",&local_59);
  error::exception::exception(peVar2,&local_38);
  __cxa_throw(peVar2,&error::exception::typeinfo,error::exception::~exception);
}

Assistant:

void blc::tools::VFile::write(const std::string &str) const {
	if (!this->_isClosed) {
		if (this->_cursor <= this->_cache.size()) {
			( const_cast <VFile*> (this) )->_cache.insert(this->_cursor, str);
			( const_cast <VFile*> (this) )->_cursor += str.size();
		} else {
			throw blc::error::exception("Cursor exeeds the size of file");
		}
	} else {
		throw blc::error::exception("Attempt to write on a closed virtual file");
	}
}